

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

char * helicsPublicationGetType(HelicsPublication pub)

{
  string *psVar1;
  
  if ((pub == (HelicsPublication)0x0) || (*pub != -0x684eff5b)) {
    psVar1 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar1 = helics::Interface::getExtractionType_abi_cxx11_(*(Interface **)((long)pub + 0x18));
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

helics::PublicationObject* verifyPublication(HelicsPublication pub, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (pub == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidPublicationString);
        return nullptr;
    }
    auto* pubObj = reinterpret_cast<helics::PublicationObject*>(pub);
    if (pubObj->valid != PublicationValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidPublicationString);
        return nullptr;
    }
    return pubObj;
}